

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_logger_fct.h
# Opt level: O0

void custlog__on_test_start(fct_logger_i *l,fct_logger_evt_t *e)

{
  fct_test_t *test;
  fct_logger_evt_t *e_local;
  fct_logger_i *l_local;
  
  printf("on_test_start:\n    -      name: %s\n",e->test->name);
  return;
}

Assistant:

static void
custlog__on_test_start(fct_logger_i *l, fct_logger_evt_t const *e)
{
    fct_test_t const *test = e->test;
    (void)l;
    (void)e;
    printf("on_test_start:\n"
           "    -      name: %s\n",
           fct_test__name(test)
          );
}